

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O2

string * __thiscall
LSMTree::get_abi_cxx11_(string *__return_storage_ptr__,LSMTree *this,longlong key)

{
  int iVar1;
  undefined4 extraout_var;
  bool success;
  allocator<char> local_41;
  undefined1 local_40 [40];
  
  iVar1 = (*(this->memory->
            super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )._vptr_Dictionary[2])(this->memory,key);
  if ((string *)CONCAT44(extraout_var,iVar1) == (string *)0x0) {
    DiskTable::get((QueryResult *)local_40,this->disk,key);
    if (local_40[0] == true) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_40 + 8));
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_41);
    }
    std::__cxx11::string::~string((string *)(local_40 + 8));
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var,iVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LSMTree::get(long long key) {
    auto memory_result = memory->get(key);
    if (memory_result != nullptr) {
        return *memory_result;
    } else {
        auto[success, disk_result]=disk->get(key);
        if (success) {
            return disk_result;
        } else {
            return "";
        }
    }
}